

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4447fb::Db::parsePrefixExpr(Db *this,StringView Kind)

{
  Node *local_30;
  Node *E;
  Db *this_local;
  StringView Kind_local;
  
  Kind_local.First = Kind.Last;
  this_local = (Db *)Kind.First;
  E = (Node *)this;
  local_30 = parseExpr(this);
  if (local_30 == (Node *)0x0) {
    Kind_local.Last = (char *)0x0;
  }
  else {
    Kind_local.Last =
         (char *)(anonymous_namespace)::Db::
                 make<(anonymous_namespace)::PrefixExpr,StringView&,(anonymous_namespace)::Node*&>
                           ((Db *)this,(StringView *)&this_local,&local_30);
  }
  return (Node *)Kind_local.Last;
}

Assistant:

Node *Db::parsePrefixExpr(StringView Kind) {
  Node *E = parseExpr();
  if (E == nullptr)
    return nullptr;
  return make<PrefixExpr>(Kind, E);
}